

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Image.cxx
# Opt level: O1

void __thiscall
Fl_Xlib_Graphics_Driver::draw
          (Fl_Xlib_Graphics_Driver *this,Fl_RGB_Image *img,int XP,int YP,int WP,int HP,int cx,int cy
          )

{
  byte *pbVar1;
  byte bVar2;
  byte bVar3;
  byte bVar4;
  byte bVar5;
  int iVar6;
  uint uVar7;
  uint uVar8;
  bool bVar9;
  int w;
  char cVar10;
  uint uVar11;
  Fl_Surface_Device *pFVar12;
  Fl_Display_Device *pFVar13;
  byte *p;
  uchar *puVar14;
  byte *pbVar15;
  int iVar16;
  int iVar17;
  int iVar18;
  Window WVar19;
  Fl_RGB_Image *pFVar20;
  byte *pbVar21;
  int iVar22;
  int H;
  int W;
  int Y;
  int X;
  int local_50;
  uint local_4c;
  Fl_RGB_Image *local_48;
  Fl_Xlib_Graphics_Driver *local_40;
  int ny;
  int nx;
  
  if (((img->super_Fl_Image).d_ == 0) || (img->array == (uchar *)0x0)) {
    Fl_Image::draw_empty(&img->super_Fl_Image,XP,YP);
    return;
  }
  local_4c = cy;
  iVar22 = (img->super_Fl_Image).w_;
  local_50 = (img->super_Fl_Image).h_;
  local_48 = img;
  local_40 = this;
  (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x2b])
            (fl_graphics_driver,(ulong)(uint)XP,(ulong)(uint)YP,WP,HP,&X,&Y,&W,&H);
  pFVar20 = local_48;
  iVar17 = (X - XP) + cx;
  if (iVar17 < 0) {
    W = W + iVar17;
    X = X - iVar17;
    iVar17 = 0;
  }
  if (iVar22 < W + iVar17) {
    W = iVar22 - iVar17;
  }
  iVar22 = (Y - YP) + local_4c;
  if (W < 1) {
    bVar9 = false;
  }
  else {
    if (iVar22 < 0) {
      H = H + iVar22;
      Y = Y - iVar22;
      iVar22 = 0;
    }
    if (local_50 < H + iVar22) {
      H = local_50 - iVar22;
    }
    bVar9 = 0 < H;
  }
  if (!bVar9) {
    return;
  }
  if (local_48->id_ != 0) goto LAB_001b8a7f;
  iVar6 = (local_48->super_Fl_Image).d_;
  if (iVar6 == 1) {
LAB_001b8906:
    uVar11 = XCreatePixmap(fl_display,
                           *(undefined8 *)
                            (*(long *)(fl_display + 0xe8) + 0x10 + (long)fl_screen * 0x80),
                           (local_48->super_Fl_Image).w_,(local_48->super_Fl_Image).h_,
                           fl_visual->depth);
    pFVar20->id_ = uVar11;
    WVar19 = fl_window;
    fl_window = (Window)uVar11;
    pFVar12 = Fl_Surface_Device::_surface;
    if (Fl_Surface_Device::_surface == (Fl_Surface_Device *)0x0) {
      pFVar12 = Fl_Surface_Device::default_surface();
    }
    pFVar13 = Fl_Display_Device::display_device();
    (*(pFVar13->super_Fl_Surface_Device).super_Fl_Device._vptr_Fl_Device[3])(pFVar13);
    (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x2d])();
    puVar14 = pFVar20->array;
    uVar7 = (pFVar20->super_Fl_Image).w_;
    uVar8 = (pFVar20->super_Fl_Image).h_;
    uVar11 = (pFVar20->super_Fl_Image).d_;
  }
  else {
    if (iVar6 != 4) {
      if (iVar6 != 3) goto LAB_001b8a7f;
      goto LAB_001b8906;
    }
    cVar10 = fl_can_do_alpha_blending();
    if (cVar10 == '\0') goto LAB_001b8a7f;
    uVar11 = XCreatePixmap(fl_display,
                           *(undefined8 *)
                            (*(long *)(fl_display + 0xe8) + 0x10 + (long)fl_screen * 0x80),
                           (pFVar20->super_Fl_Image).w_,(pFVar20->super_Fl_Image).h_,0x20);
    pFVar20->id_ = uVar11;
    WVar19 = fl_window;
    fl_window = (Window)uVar11;
    pFVar12 = Fl_Surface_Device::_surface;
    if (Fl_Surface_Device::_surface == (Fl_Surface_Device *)0x0) {
      pFVar12 = Fl_Surface_Device::default_surface();
    }
    pFVar13 = Fl_Display_Device::display_device();
    (*(pFVar13->super_Fl_Surface_Device).super_Fl_Device._vptr_Fl_Device[3])(pFVar13);
    (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x2d])();
    puVar14 = pFVar20->array;
    uVar7 = (pFVar20->super_Fl_Image).w_;
    uVar11 = (pFVar20->super_Fl_Image).d_ | 0x40000000;
    uVar8 = (pFVar20->super_Fl_Image).h_;
  }
  (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x2f])
            (fl_graphics_driver,puVar14,0,0,(ulong)uVar7,(ulong)uVar8,(ulong)uVar11,
             (ulong)(uint)(pFVar20->super_Fl_Image).ld_);
  (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x2e])();
  fl_window = WVar19;
  (*(pFVar12->super_Fl_Device)._vptr_Fl_Device[3])(pFVar12);
  pFVar20 = local_48;
LAB_001b8a7f:
  w = W;
  iVar6 = H;
  if (pFVar20->id_ == 0) {
    local_48 = (Fl_RGB_Image *)CONCAT44(local_48._4_4_,X);
    local_4c = Y;
    iVar18 = (pFVar20->super_Fl_Image).ld_;
    if (iVar18 == 0) {
      iVar18 = (pFVar20->super_Fl_Image).d_ * (pFVar20->super_Fl_Image).w_;
    }
    iVar16 = (pFVar20->super_Fl_Image).d_;
    pbVar21 = pFVar20->array + (long)(iVar17 * iVar16) + (long)(iVar22 * iVar18);
    iVar18 = iVar18 - iVar16 * W;
    p = (byte *)operator_new__((long)(W * H * 3));
    fl_read_image(p,(int)local_48,local_4c,w,iVar6,0);
    local_50 = iVar6;
    if ((pFVar20->super_Fl_Image).d_ == 2) {
      if (0 < iVar6) {
        pbVar15 = p;
        iVar22 = iVar6;
        do {
          iVar17 = w + 1;
          if (0 < w) {
            do {
              bVar2 = *pbVar21;
              pbVar1 = pbVar21 + 1;
              pbVar21 = pbVar21 + 2;
              iVar16 = (uint)bVar2 * (uint)*pbVar1;
              uVar11 = *pbVar1 ^ 0xff;
              *pbVar15 = (byte)(*pbVar15 * uVar11 + iVar16 >> 8);
              pbVar15[1] = (byte)(pbVar15[1] * uVar11 + iVar16 >> 8);
              pbVar15[2] = (byte)(uVar11 * pbVar15[2] + iVar16 >> 8);
              pbVar15 = pbVar15 + 3;
              iVar17 = iVar17 + -1;
            } while (1 < iVar17);
          }
          pbVar21 = pbVar21 + iVar18;
          bVar9 = 1 < iVar22;
          iVar22 = iVar22 + -1;
        } while (bVar9);
      }
    }
    else if (0 < iVar6) {
      pbVar15 = p;
      iVar22 = iVar6;
      do {
        iVar17 = w + 1;
        if (0 < w) {
          do {
            bVar2 = *pbVar21;
            bVar3 = pbVar21[1];
            bVar4 = pbVar21[2];
            bVar5 = pbVar21[3];
            pbVar21 = pbVar21 + 4;
            uVar11 = bVar5 ^ 0xff;
            *pbVar15 = (byte)(*pbVar15 * uVar11 + (uint)bVar2 * (uint)bVar5 >> 8);
            pbVar15[1] = (byte)(pbVar15[1] * uVar11 + (uint)bVar3 * (uint)bVar5 >> 8);
            pbVar15[2] = (byte)(uVar11 * pbVar15[2] + (uint)bVar4 * (uint)bVar5 >> 8);
            pbVar15 = pbVar15 + 3;
            iVar17 = iVar17 + -1;
          } while (1 < iVar17);
        }
        pbVar21 = pbVar21 + iVar18;
        bVar9 = 1 < iVar22;
        iVar22 = iVar22 + -1;
      } while (bVar9);
    }
    (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x2f])
              (fl_graphics_driver,p,(ulong)local_48 & 0xffffffff,(ulong)local_4c,(ulong)(uint)w,
               (ulong)(uint)iVar6,3,0);
    operator_delete__(p);
  }
  else {
    if (pFVar20->mask_ != 0) {
      (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x2b])
                (fl_graphics_driver,(ulong)(uint)X,(ulong)(uint)Y,(ulong)(uint)W,(ulong)(uint)H,&nx,
                 &ny,&W,&H);
      iVar17 = (nx - X) + iVar17;
      X = nx;
      iVar22 = (ny - Y) + iVar22;
      Y = ny;
      XSetClipMask(fl_display,fl_gc,pFVar20->mask_);
      XSetClipOrigin(fl_display,fl_gc,X - iVar17,Y - iVar22);
    }
    if (((pFVar20->super_Fl_Image).d_ == 4) && (cVar10 = fl_can_do_alpha_blending(), cVar10 != '\0')
       ) {
      copy_offscreen_with_alpha(local_40,X,Y,W,H,(ulong)pFVar20->id_,iVar17,iVar22);
    }
    else {
      copy_offscreen(local_40,X,Y,W,H,(ulong)pFVar20->id_,iVar17,iVar22);
    }
    if (pFVar20->mask_ != 0) {
      XSetClipOrigin(fl_display,fl_gc,0,0);
      Fl_Graphics_Driver::restore_clip(fl_graphics_driver);
    }
  }
  return;
}

Assistant:

void Fl_Xlib_Graphics_Driver::draw(Fl_RGB_Image *img, int XP, int YP, int WP, int HP, int cx, int cy) {
  int X, Y, W, H;
  // Don't draw an empty image...
  if (!img->d() || !img->array) {
    img->draw_empty(XP, YP);
    return;
  }
  if (start(img, XP, YP, WP, HP, img->w(), img->h(), cx, cy, X, Y, W, H)) {
    return;
  }
  if (!img->id_) {
    if (img->d() == 1 || img->d() == 3) {
      img->id_ = fl_create_offscreen(img->w(), img->h());
      fl_begin_offscreen((Fl_Offscreen)img->id_);
      fl_draw_image(img->array, 0, 0, img->w(), img->h(), img->d(), img->ld());
      fl_end_offscreen();
    } else if (img->d() == 4 && fl_can_do_alpha_blending()) {
      img->id_ = fl_create_offscreen_with_alpha(img->w(), img->h());
      fl_begin_offscreen((Fl_Offscreen)img->id_);
      fl_draw_image(img->array, 0, 0, img->w(), img->h(), img->d() | FL_IMAGE_WITH_ALPHA,
                    img->ld());
      fl_end_offscreen();
    }
  }
  if (img->id_) {
    if (img->mask_) {
      // I can't figure out how to combine a mask with existing region,
      // so cut the image down to a clipped rectangle:
      int nx, ny; fl_clip_box(X,Y,W,H,nx,ny,W,H);
      cx += nx-X; X = nx;
      cy += ny-Y; Y = ny;
      // make X use the bitmap as a mask:
      XSetClipMask(fl_display, fl_gc, img->mask_);
      int ox = X-cx; if (ox < 0) ox += img->w();
      int oy = Y-cy; if (oy < 0) oy += img->h();
      XSetClipOrigin(fl_display, fl_gc, X-cx, Y-cy);
    }

    if (img->d() == 4 && fl_can_do_alpha_blending())
      copy_offscreen_with_alpha(X, Y, W, H, img->id_, cx, cy);
    else
      copy_offscreen(X, Y, W, H, img->id_, cx, cy);

    if (img->mask_) {
      // put the old clip region back
      XSetClipOrigin(fl_display, fl_gc, 0, 0);
      fl_restore_clip();
    }
  } else {
    // Composite image with alpha manually each time...
    alpha_blend(img, X, Y, W, H, cx, cy);
  }
}